

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::truncF16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Type *__return_storage_ptr___00;
  Literal *this_00;
  long lVar1;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  undefined1 local_120 [8];
  LaneArray<8> lanes;
  Literal local_48;
  
  getLanesF16x8((LaneArray<8> *)local_120,this);
  __return_storage_ptr___00 = &lanes._M_elems[7].type;
  __x = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x18) {
    this_00 = (Literal *)(local_120 + lVar1);
    trunc(&local_48,__x);
    convertF32ToF16((Literal *)__return_storage_ptr___00,&local_48);
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    ~Literal(&local_48);
    __x = extraout_XMM0_Qa_00;
  }
  Literal(__return_storage_ptr__,(LaneArray<8> *)local_120);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_120);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncF16x8() const {
  return unary<8, &Literal::getLanesF16x8, &Literal::trunc, &toFP16>(*this);
}